

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_socket_connect(ENetSocket socket,ENetAddress *address)

{
  int *piVar1;
  undefined1 local_34 [4];
  int result;
  sockaddr_in6 sin;
  ENetAddress *address_local;
  ENetSocket socket_local;
  
  sin._20_8_ = address;
  memset(local_34,0,0x1c);
  local_34._0_2_ = 10;
  local_34._2_2_ = htons(*(uint16_t *)(sin._20_8_ + 0x10));
  sin._0_8_ = *(undefined8 *)sin._20_8_;
  sin.sin6_addr.__in6_u._0_8_ = *(undefined8 *)(sin._20_8_ + 8);
  sin.sin6_addr.__in6_u.__u6_addr32[2] = (uint32_t)*(ushort *)(sin._20_8_ + 0x12);
  address_local._4_4_ = connect(socket,(sockaddr *)local_34,0x1c);
  if ((address_local._4_4_ == -1) && (piVar1 = __errno_location(), *piVar1 == 0x73)) {
    address_local._4_4_ = 0;
  }
  return address_local._4_4_;
}

Assistant:

int enet_socket_connect(ENetSocket socket, const ENetAddress *address) {
        struct sockaddr_in6 sin;
        int result;

        memset(&sin, 0, sizeof(struct sockaddr_in6));

        sin.sin6_family     = AF_INET6;
        sin.sin6_port       = ENET_HOST_TO_NET_16(address->port);
        sin.sin6_addr       = address->host;
        sin.sin6_scope_id   = address->sin6_scope_id;

        result = connect(socket, (struct sockaddr *)&sin, sizeof(struct sockaddr_in6));
        if (result == -1 && errno == EINPROGRESS) {
            return 0;
        }

        return result;
    }